

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall amrex::ForkJoin::create_task_output_dir(ForkJoin *this)

{
  bool bVar1;
  byte *in_RDI;
  undefined4 in_stack_fffffffffffffe38;
  undefined1 verbose;
  mode_t in_stack_fffffffffffffe3c;
  Print *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe68;
  Print *in_stack_fffffffffffffe70;
  Print *in_stack_fffffffffffffeb0;
  
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe40,
                          (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if ((bVar1) && (bVar1 = FileExists((string *)0x12134b9), !bVar1)) {
    if ((*in_RDI & 1) != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      Print::operator<<(in_stack_fffffffffffffe40,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                       );
      in_stack_fffffffffffffe40 =
           Print::operator<<(in_stack_fffffffffffffe40,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      Print::operator<<(in_stack_fffffffffffffe40,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      Print::~Print(in_stack_fffffffffffffeb0);
    }
    verbose = (undefined1)((uint)in_stack_fffffffffffffe38 >> 0x18);
    bVar1 = ParallelContext::IOProcessorSub();
    if (bVar1) {
      UtilCreateDirectory((string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                          (bool)verbose);
    }
  }
  return;
}

Assistant:

void ForkJoin::create_task_output_dir ()
{
    if (task_output_dir != "" && !amrex::FileExists(task_output_dir)) {
        if (flag_verbose) {
            Print() << "Creating task_output_dir: " << task_output_dir << std::endl;
        }
        if (ParallelContext::IOProcessorSub()) {
            amrex::UtilCreateDirectory(task_output_dir, 0755, flag_verbose);
        }
    }
}